

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O1

ON_GeometryValue * __thiscall
ON_GeometryValue::operator=(ON_GeometryValue *this,ON_GeometryValue *src)

{
  ON_SimpleArray<ON_Geometry_*> *this_00;
  uint uVar1;
  ON_Geometry **ppOVar2;
  ON_Geometry *pOVar3;
  ON_Geometry *in_RAX;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ON_Geometry *ptr;
  ON_Geometry *local_38;
  
  if (this != src) {
    this_00 = &this->m_value;
    lVar5 = (long)(this->m_value).m_count;
    local_38 = in_RAX;
    if (0 < lVar5) {
      lVar6 = 0;
      do {
        ppOVar2 = (this->m_value).m_a;
        pOVar3 = ppOVar2[lVar6];
        ppOVar2[lVar6] = (ON_Geometry *)0x0;
        if (pOVar3 != (ON_Geometry *)0x0) {
          (*(pOVar3->super_ON_Object)._vptr_ON_Object[4])();
        }
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
    }
    ON_SimpleArray<ON_Geometry_*>::SetCapacity(this_00,0);
    (this->super_ON_Value).m_value_id = (src->super_ON_Value).m_value_id;
    uVar1 = (src->m_value).m_count;
    if ((uint)(this->m_value).m_capacity < uVar1) {
      ON_SimpleArray<ON_Geometry_*>::SetCapacity(this_00,(long)(int)uVar1);
    }
    if (0 < (int)uVar1) {
      sVar4 = 0;
      do {
        pOVar3 = (src->m_value).m_a[sVar4];
        if (pOVar3 != (ON_Geometry *)0x0) {
          local_38 = ON_Geometry::Duplicate(pOVar3);
          if (local_38 != (ON_Geometry *)0x0) {
            ON_SimpleArray<ON_Geometry_*>::Append(this_00,&local_38);
          }
        }
        sVar4 = sVar4 + 1;
      } while ((long)(int)uVar1 != sVar4);
    }
  }
  return this;
}

Assistant:

ON_GeometryValue& ON_GeometryValue::operator=(const ON_GeometryValue& src)
{
  if ( this != &src )
  {
    int i, count = m_value.Count();
    for ( i = 0; i < count; i++ )
    {
      ON_Geometry* p = m_value[i];
      m_value[i] = 0;
      if (p)
      {
        delete p;
      }
    }
    m_value.Destroy();

    m_value_id = src.m_value_id;

    count = src.m_value.Count();
    m_value.Reserve(count);
    for ( i = 0; i < count; i++ )
    {
      const ON_Geometry* src_ptr = src.m_value[i];
      if ( !src_ptr )
        continue;
      ON_Geometry* ptr = src_ptr->Duplicate();
      if ( ptr )
        m_value.Append(ptr);
    }
  }
  return *this;
}